

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool op_stl(DisasContext_conflict1 *s,arg_STL *a,MemOp mop)

{
  uint64_t uVar1;
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i32 a32;
  TCGv_i32 val;
  uintptr_t o;
  
  uVar1 = s->features;
  if (((uint)uVar1 >> 0x1b & 1) != 0) {
    if ((a->rn == 0xf) || (a->rt == 0xf)) {
      unallocated_encoding_aarch64(s);
    }
    else {
      tcg_ctx = s->uc->tcg_ctx;
      a32 = load_reg(s,a->rn);
      val = load_reg(s,a->rt);
      tcg_gen_mb_aarch64(tcg_ctx,TCG_BAR_STRL|TCG_MO_ALL);
      gen_aa32_st_i32(s,val,a32,s->mmu_idx & 0xf,s->be_data | mop);
      disas_set_da_iss(s,mop,a->rt | (ISSIsWrite|ISSIsAcqRel));
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(val + (long)tcg_ctx));
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(a32 + (long)tcg_ctx));
    }
  }
  return (_Bool)((byte)(uVar1 >> 0x18) >> 3 & 1);
}

Assistant:

static bool op_stl(DisasContext *s, arg_STL *a, MemOp mop)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 addr, tmp;

    if (!ENABLE_ARCH_8) {
        return false;
    }
    /* We UNDEF for these UNPREDICTABLE cases.  */
    if (a->rn == 15 || a->rt == 15) {
        unallocated_encoding(s);
        return true;
    }

    addr = load_reg(s, a->rn);
    tmp = load_reg(s, a->rt);
    tcg_gen_mb(tcg_ctx, TCG_MO_ALL | TCG_BAR_STRL);
    gen_aa32_st_i32(s, tmp, addr, get_mem_index(s), mop | s->be_data);
    disas_set_da_iss(s, mop, a->rt | ISSIsAcqRel | ISSIsWrite);

    tcg_temp_free_i32(tcg_ctx, tmp);
    tcg_temp_free_i32(tcg_ctx, addr);
    return true;
}